

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetgen.cxx
# Opt level: O1

int __thiscall tetgenmesh::checksegments(tetgenmesh *this)

{
  memorypool *pmVar1;
  void **ppvVar2;
  tetrahedron ppdVar3;
  tetrahedron ppdVar4;
  tetrahedron ppdVar5;
  double *pdVar6;
  tetrahedron ppdVar7;
  ulong uVar8;
  int iVar9;
  tetrahedron *pppdVar10;
  ulong *puVar11;
  void *pvVar12;
  long lVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  char *__format;
  ulong uVar17;
  uint uVar18;
  ulong *puVar19;
  ulong uVar20;
  tetrahedron *pppdVar21;
  ulong uVar22;
  tetrahedron *pppdVar23;
  uint uVar24;
  ulong uVar25;
  ulong in_stack_ffffffffffffff78;
  int local_64;
  ulong local_50;
  
  if (this->b->quiet == 0) {
    puts("  Checking tet->seg connections...");
  }
  pmVar1 = this->tetrahedrons;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  local_50 = 0;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  pppdVar10 = tetrahedrontraverse(this);
  uVar14 = 0;
  if (pppdVar10 != (tetrahedron *)0x0) {
    uVar14 = 0;
    local_50 = 0;
    do {
      ppdVar3 = pppdVar10[8];
      if (ppdVar3 != (tetrahedron)0x0) {
        lVar13 = 0;
        do {
          uVar16 = (ulong)ppdVar3[lVar13] & 0xfffffffffffffff8;
          if (uVar16 != 0) {
            iVar9 = edge2ver[lVar13];
            ppdVar4 = *(tetrahedron *)(uVar16 + 0x18);
            ppdVar5 = *(tetrahedron *)(uVar16 + 0x20);
            pppdVar23 = pppdVar10;
            if (((pppdVar10[orgpivot[iVar9]] == ppdVar4) && (pppdVar10[destpivot[iVar9]] == ppdVar5)
                ) || ((pppdVar10[orgpivot[iVar9]] == ppdVar5 &&
                      (pppdVar10[destpivot[iVar9]] == ppdVar4)))) {
              do {
                if (pppdVar23[8] == (tetrahedron)0x0) {
                  uVar22 = 0;
                }
                else {
                  pdVar6 = pppdVar23[8][ver2edge[iVar9]];
                  local_50 = (ulong)((uint)pdVar6 & 7);
                  uVar22 = (ulong)pdVar6 & 0xfffffffffffffff8;
                }
                if (uVar22 != uVar16) {
                  puts("  !! Wrong tet->seg connection.");
                  lVar15 = (long)this->pointmarkindex;
                  printf("    Tet: x%lx (%d, %d, %d, %d) - ",pppdVar23,
                         (ulong)*(uint *)((long)pppdVar23[orgpivot[iVar9]] + lVar15 * 4),
                         (ulong)*(uint *)((long)pppdVar23[destpivot[iVar9]] + lVar15 * 4),
                         (ulong)*(uint *)((long)pppdVar23[apexpivot[iVar9]] + lVar15 * 4),
                         (ulong)*(uint *)((long)pppdVar23[oppopivot[iVar9]] + lVar15 * 4));
                  if (uVar22 == 0) {
                    puts("Seg: NULL.");
                  }
                  else {
                    printf("Seg x%lx (%d, %d).\n",uVar22,
                           (ulong)*(uint *)(*(long *)(uVar22 + (long)sorgpivot[local_50] * 8) +
                                           (long)this->pointmarkindex * 4),
                           (ulong)*(uint *)(*(long *)(uVar22 + (long)sdestpivot[local_50] * 8) +
                                           (long)this->pointmarkindex * 4));
                  }
                  uVar14 = uVar14 + 1;
                }
                pppdVar21 = (tetrahedron *)
                            ((ulong)pppdVar23[facepivot1[iVar9]] & 0xfffffffffffffff0);
                iVar9 = facepivot2[iVar9][(uint)pppdVar23[facepivot1[iVar9]] & 0xf];
                pppdVar23 = pppdVar21;
              } while (pppdVar10 != pppdVar21);
            }
            else {
              puts("  !! Wrong tet-seg connection.");
              lVar15 = (long)this->pointmarkindex;
              in_stack_ffffffffffffff78 = uVar16;
              printf("    Tet: x%lx (%d, %d, %d, %d) - Seg: x%lx (%d, %d).\n",pppdVar10,
                     (ulong)*(uint *)((long)pppdVar10[orgpivot[iVar9]] + lVar15 * 4),
                     (ulong)*(uint *)((long)pppdVar10[destpivot[iVar9]] + lVar15 * 4),
                     (ulong)*(uint *)((long)pppdVar10[apexpivot[iVar9]] + lVar15 * 4),
                     (ulong)*(uint *)((long)pppdVar10[oppopivot[iVar9]] + lVar15 * 4),uVar16,
                     *(undefined4 *)((long)ppdVar4 + lVar15 * 4),
                     *(undefined4 *)((long)ppdVar5 + lVar15 * 4));
              uVar14 = uVar14 + 1;
            }
            uVar22 = *(ulong *)(uVar16 + 0x48) & 0xfffffffffffffff0;
            if (uVar22 == 0) {
              puts("  !! Wrong seg->tet connection (A NULL tet).");
            }
            else {
              uVar24 = (uint)*(ulong *)(uVar16 + 0x48) & 0xf;
              ppdVar7 = *(tetrahedron *)(uVar22 + (long)orgpivot[uVar24] * 8);
              if (((ppdVar7 == ppdVar4) &&
                  (*(tetrahedron *)(uVar22 + (long)destpivot[uVar24] * 8) == ppdVar5)) ||
                 ((ppdVar7 == ppdVar5 &&
                  (*(tetrahedron *)(uVar22 + (long)destpivot[uVar24] * 8) == ppdVar4))))
              goto LAB_00151549;
              puts("  !! Wrong seg->tet connection (Wrong edge).");
              uVar25 = (ulong)(uVar24 << 2);
              lVar15 = (long)this->pointmarkindex;
              printf("    Tet: x%lx (%d, %d, %d, %d) - Seg: x%lx (%d, %d).\n",uVar22,
                     (ulong)*(uint *)(*(long *)(uVar22 + (long)*(int *)((long)orgpivot + uVar25) * 8
                                               ) + lVar15 * 4),
                     (ulong)*(uint *)(*(long *)(uVar22 + (long)*(int *)((long)destpivot + uVar25) *
                                                         8) + lVar15 * 4),
                     (ulong)*(uint *)(*(long *)(uVar22 + (long)*(int *)((long)apexpivot + uVar25) *
                                                         8) + lVar15 * 4),
                     (ulong)*(uint *)(*(long *)(uVar22 + (long)*(int *)((long)oppopivot + uVar25) *
                                                         8) + lVar15 * 4),uVar16,
                     *(undefined4 *)((long)ppdVar4 + lVar15 * 4),
                     *(undefined4 *)((long)ppdVar5 + lVar15 * 4));
              in_stack_ffffffffffffff78 = uVar16;
            }
            uVar14 = uVar14 + 1;
          }
LAB_00151549:
          lVar13 = lVar13 + 1;
        } while (lVar13 != 6);
      }
      lVar13 = 0;
      do {
        iVar9 = edge2ver[lVar13];
        if ((*(uint *)((long)pppdVar10 + (long)this->elemmarkerindex * 4) >>
             (*(byte *)(ver2edge + iVar9) & 0x1f) & 0x40) != 0) {
          lVar15 = (long)this->pointmarkindex;
          in_stack_ffffffffffffff78 = CONCAT44((int)(in_stack_ffffffffffffff78 >> 0x20),iVar9);
          printf("  !! A marked edge: (%d, %d, %d, %d) -- x%lx %d.\n",
                 (ulong)*(uint *)((long)pppdVar10[orgpivot[iVar9]] + lVar15 * 4),
                 (ulong)*(uint *)((long)pppdVar10[destpivot[iVar9]] + lVar15 * 4),
                 (ulong)*(uint *)((long)pppdVar10[apexpivot[iVar9]] + lVar15 * 4),
                 (ulong)*(uint *)((long)pppdVar10[oppopivot[iVar9]] + lVar15 * 4),pppdVar10,
                 in_stack_ffffffffffffff78);
          pppdVar23 = pppdVar10;
          do {
            pppdVar21 = pppdVar23 + facepivot1[iVar9];
            pppdVar23 = (tetrahedron *)((ulong)*pppdVar21 & 0xfffffffffffffff0);
            iVar9 = facepivot2[iVar9][(uint)*pppdVar21 & 0xf];
            if ((*(uint *)((long)pppdVar23 + (long)this->elemmarkerindex * 4) >>
                 (*(byte *)(ver2edge + iVar9) & 0x1f) & 0x40) == 0) {
              lVar15 = (long)this->pointmarkindex;
              in_stack_ffffffffffffff78 = CONCAT44((int)(in_stack_ffffffffffffff78 >> 0x20),iVar9);
              printf("  !! !! An unmarked edge (%d, %d, %d, %d) -- x%lx %d.\n",
                     (ulong)*(uint *)((long)pppdVar23[orgpivot[iVar9]] + lVar15 * 4),
                     (ulong)*(uint *)((long)pppdVar23[destpivot[iVar9]] + lVar15 * 4),
                     (ulong)*(uint *)((long)pppdVar23[apexpivot[iVar9]] + lVar15 * 4),
                     (ulong)*(uint *)((long)pppdVar23[oppopivot[iVar9]] + lVar15 * 4),pppdVar23,
                     in_stack_ffffffffffffff78);
              uVar14 = uVar14 + 1;
            }
          } while (pppdVar10 != pppdVar23);
        }
        lVar13 = lVar13 + 1;
      } while (lVar13 != 6);
      pppdVar10 = tetrahedrontraverse(this);
    } while (pppdVar10 != (tetrahedron *)0x0);
  }
  if (this->b->quiet == 0) {
    puts("  Checking seg->tet connections...");
  }
  pmVar1 = this->subsegs;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  do {
    puVar11 = (ulong *)memorypool::traverse(pmVar1);
    if (puVar11 == (ulong *)0x0) {
      puVar11 = (ulong *)0x0;
      break;
    }
  } while (puVar11[3] == 0);
  if (puVar11 == (ulong *)0x0) {
    local_64 = 0;
  }
  else {
    local_64 = 0;
    do {
      uVar16 = *puVar11;
      uVar22 = uVar16 & 0xfffffffffffffff8;
      if (uVar22 != 0) {
        uVar25 = puVar11[sorgpivot[0]];
        uVar8 = puVar11[sdestpivot[0]];
        uVar17 = uVar22;
        while( true ) {
          uVar24 = (uint)uVar16;
          uVar18 = uVar24 & 7;
          uVar16 = *(ulong *)(uVar17 + (long)sorgpivot[uVar18] * 8);
          if (((uVar16 != uVar25) || (*(ulong *)(uVar17 + (long)sdestpivot[uVar18] * 8) != uVar8))
             && ((uVar16 != uVar8 || (*(ulong *)(uVar17 + (long)sdestpivot[uVar18] * 8) != uVar25)))
             ) break;
          uVar16 = *(ulong *)(uVar17 + 0x48 + (ulong)(uVar24 & 1) * 8);
          uVar20 = uVar16 & 0xfffffffffffffff0;
          if (uVar20 != 0) {
            uVar18 = stpivottbl[(uint)uVar16 & 0xf][uVar18];
            do {
              if (*(long *)(uVar20 + 0x40) == 0) {
                puVar19 = (ulong *)0x0;
              }
              else {
                uVar16 = *(ulong *)(*(long *)(uVar20 + 0x40) + (long)ver2edge[(int)uVar18] * 8);
                local_50 = (ulong)((uint)uVar16 & 7);
                puVar19 = (ulong *)(uVar16 & 0xfffffffffffffff8);
              }
              if (puVar19 == (ulong *)0x0) {
                lVar13 = (long)this->pointmarkindex;
                in_stack_ffffffffffffff78 =
                     CONCAT44((int)(in_stack_ffffffffffffff78 >> 0x20),uVar18);
                printf("  !! !! No seg at tet (%d, %d, %d, %d) -- x%lx %d\n",
                       (ulong)*(uint *)(*(long *)(uVar20 + (long)orgpivot[(int)uVar18] * 8) +
                                       lVar13 * 4),
                       (ulong)*(uint *)(*(long *)(uVar20 + (long)destpivot[(int)uVar18] * 8) +
                                       lVar13 * 4),
                       (ulong)*(uint *)(*(long *)(uVar20 + (long)apexpivot[(int)uVar18] * 8) +
                                       lVar13 * 4),
                       (ulong)*(uint *)(*(long *)(uVar20 + (long)oppopivot[(int)uVar18] * 8) +
                                       lVar13 * 4),uVar20,in_stack_ffffffffffffff78);
                uVar14 = uVar14 + 1;
              }
              if (puVar19 != puVar11) {
                lVar13 = (long)this->pointmarkindex;
                in_stack_ffffffffffffff78 =
                     CONCAT44((int)(in_stack_ffffffffffffff78 >> 0x20),
                              *(undefined4 *)
                               (*(long *)(uVar20 + (long)oppopivot[(int)uVar18] * 8) + lVar13 * 4));
                printf("  !! !! Wrong seg (%d, %d) at tet (%d, %d, %d, %d)\n",
                       (ulong)*(uint *)(puVar19[sorgpivot[local_50]] + lVar13 * 4),
                       (ulong)*(uint *)(puVar19[sdestpivot[local_50]] + lVar13 * 4),
                       (ulong)*(uint *)(*(long *)(uVar20 + (long)orgpivot[(int)uVar18] * 8) +
                                       lVar13 * 4),
                       (ulong)*(uint *)(*(long *)(uVar20 + (long)destpivot[(int)uVar18] * 8) +
                                       lVar13 * 4),
                       (ulong)*(uint *)(*(long *)(uVar20 + (long)apexpivot[(int)uVar18] * 8) +
                                       lVar13 * 4),in_stack_ffffffffffffff78);
                uVar14 = uVar14 + 1;
              }
              uVar16 = *(ulong *)(uVar20 + (long)facepivot1[(int)uVar18] * 8);
              uVar20 = uVar16 & 0xfffffffffffffff0;
              uVar18 = facepivot2[(int)uVar18][(uint)uVar16 & 0xf];
            } while ((*(long *)(uVar20 + 0x48) == 0) ||
                    (*(ulong *)(*(long *)(uVar20 + 0x48) + (ulong)(uVar18 & 3) * 8) < 8));
          }
          uVar16 = *(ulong *)(uVar17 + (ulong)(uVar24 & 6) * 4);
          uVar17 = uVar16 & 0xfffffffffffffff8;
          if ((uVar17 == 0) || (uVar17 == uVar22)) goto LAB_00151a0c;
        }
        lVar13 = (long)this->pointmarkindex;
        printf("  !! Wrong seg-subface (%d, %d, %d) -- x%lx %d connect\n",
               (ulong)*(uint *)(uVar16 + lVar13 * 4),
               (ulong)*(uint *)(*(long *)(uVar17 + (long)*(int *)((long)sdestpivot +
                                                                 (ulong)(uVar18 * 4)) * 8) +
                               lVar13 * 4),
               (ulong)*(uint *)(*(long *)(uVar17 + (long)*(int *)((long)sapexpivot +
                                                                 (ulong)(uVar18 * 4)) * 8) +
                               lVar13 * 4));
        uVar14 = uVar14 + 1;
      }
LAB_00151a0c:
      local_64 = local_64 + (uint)(puVar11[9] < 0x10);
      pmVar1 = this->subsegs;
      do {
        puVar11 = (ulong *)memorypool::traverse(pmVar1);
        if (puVar11 == (ulong *)0x0) {
          puVar11 = (ulong *)0x0;
          break;
        }
      } while (puVar11[3] == 0);
    } while (puVar11 != (ulong *)0x0);
  }
  if (this->b->quiet == 0) {
    puts("  Checking seg->seg connections...");
  }
  pmVar1 = this->points;
  ppvVar2 = pmVar1->firstblock;
  pmVar1->pathblock = ppvVar2;
  pmVar1->pathitem =
       (void *)((long)ppvVar2 +
               (((long)pmVar1->alignbytes + 8U) -
               (ulong)(ppvVar2 + 1) % (ulong)(long)pmVar1->alignbytes));
  pmVar1->pathitemsleft = pmVar1->itemsperblock;
  do {
    pvVar12 = memorypool::traverse(this->points);
    if (pvVar12 == (void *)0x0) {
      pvVar12 = (void *)0x0;
      break;
    }
  } while ((*(uint *)((long)pvVar12 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00);
  do {
    if (pvVar12 == (void *)0x0) {
      if (uVar14 == 0) {
        puts("  Segments are connected properly.");
      }
      else {
        printf("  !! !! !! !! Found %d missing connections.\n",(ulong)uVar14);
      }
      if (local_64 != 0) {
        printf("  !! !! Found %d missing segments.\n");
      }
      return uVar14;
    }
    if ((*(uint *)((long)pvVar12 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0x600) {
      __format = "  !! Dead point-to-seg pointer at point %d.\n";
      uVar16 = *(ulong *)((long)pvVar12 + (long)this->point2simindex * 8 + 0x10) &
               0xfffffffffffffff8;
      if ((uVar16 != 0) &&
         (__format = "  !! Dead point-to-seg pointer at point %d.\n", *(long *)(uVar16 + 0x18) != 0)
         ) {
        lVar13 = (long)sorgpivot[0];
        if (*(void **)(uVar16 + lVar13 * 8) == pvVar12) {
          uVar16 = *(ulong *)(uVar16 + (long)(snextpivot[snextpivot[0]] >> 1) * 8);
          lVar13 = (long)sdestpivot[0];
        }
        else {
          __format = "  !! Wrong point-to-seg pointer at point %d.\n";
          if (*(void **)(uVar16 + (long)sdestpivot[0] * 8) != pvVar12) goto LAB_00151b7a;
          uVar16 = *(ulong *)(uVar16 + (long)(snextpivot[0] >> 1) * 8);
        }
        __format = "  !! Wrong seg-seg connection at point %d.\n";
        if (*(void **)((uVar16 & 0xfffffffffffffff8) + lVar13 * 8) == pvVar12) goto LAB_00151b86;
      }
LAB_00151b7a:
      printf(__format,(ulong)*(uint *)((long)pvVar12 + (long)this->pointmarkindex * 4));
      uVar14 = uVar14 + 1;
    }
LAB_00151b86:
    do {
      pvVar12 = memorypool::traverse(this->points);
      if (pvVar12 == (void *)0x0) {
        pvVar12 = (void *)0x0;
        break;
      }
    } while ((*(uint *)((long)pvVar12 + (long)this->pointmarkindex * 4 + 4) & 0xffffff00) == 0xa00);
  } while( true );
}

Assistant:

int tetgenmesh::checksegments()
{
  triface tetloop, neightet, spintet;
  shellface *segs;
  face neighsh, spinsh, checksh;
  face sseg, checkseg;
  point pa, pb;
  int miscount;
  int t1ver;
  int horrors, i;


  if (!b->quiet) {
    printf("  Checking tet->seg connections...\n");
  }

  horrors = 0;
  tetrahedrons->traversalinit();
  tetloop.tet = tetrahedrontraverse();
  while (tetloop.tet != NULL) {
    // Loop the six edges of the tet.
    if (tetloop.tet[8] != NULL) {
      segs = (shellface *) tetloop.tet[8];
      for (i = 0; i < 6; i++) {
        sdecode(segs[i], sseg);
        if (sseg.sh != NULL) {
          // Get the edge of the tet.
          tetloop.ver = edge2ver[i];
          // Check if they are the same edge.
          pa = (point) sseg.sh[3];
          pb = (point) sseg.sh[4];
          if (!(((org(tetloop) == pa) && (dest(tetloop) == pb)) ||
                ((org(tetloop) == pb) && (dest(tetloop) == pa)))) {
            printf("  !! Wrong tet-seg connection.\n");
            printf("    Tet: x%lx (%d, %d, %d, %d) - Seg: x%lx (%d, %d).\n", 
                   (uintptr_t) tetloop.tet, pointmark(org(tetloop)),
                   pointmark(dest(tetloop)), pointmark(apex(tetloop)),
                   pointmark(oppo(tetloop)), (uintptr_t) sseg.sh,
                   pointmark(pa), pointmark(pb));
            horrors++;
          } else {
            // Loop all tets sharing at this edge.
            neightet = tetloop;
            do {
              tsspivot1(neightet, checkseg);
              if (checkseg.sh != sseg.sh) {
                printf("  !! Wrong tet->seg connection.\n");
                printf("    Tet: x%lx (%d, %d, %d, %d) - ", 
                       (uintptr_t) neightet.tet, pointmark(org(neightet)),
                       pointmark(dest(neightet)), pointmark(apex(neightet)),
                       pointmark(oppo(neightet)));
                if (checkseg.sh != NULL) {
                  printf("Seg x%lx (%d, %d).\n", (uintptr_t) checkseg.sh,
                         pointmark(sorg(checkseg)),pointmark(sdest(checkseg))); 
                } else {
                  printf("Seg: NULL.\n");
                }
                horrors++;
              }
              fnextself(neightet);
            } while (neightet.tet != tetloop.tet);
          }
          // Check the seg->tet pointer.
          sstpivot1(sseg, neightet);
          if (neightet.tet == NULL) {
            printf("  !! Wrong seg->tet connection (A NULL tet).\n");
            horrors++;
          } else {
            if (!(((org(neightet) == pa) && (dest(neightet) == pb)) ||
                ((org(neightet) == pb) && (dest(neightet) == pa)))) {
              printf("  !! Wrong seg->tet connection (Wrong edge).\n");
              printf("    Tet: x%lx (%d, %d, %d, %d) - Seg: x%lx (%d, %d).\n", 
                     (uintptr_t) neightet.tet, pointmark(org(neightet)),
                     pointmark(dest(neightet)), pointmark(apex(neightet)),
                     pointmark(oppo(neightet)), (uintptr_t) sseg.sh,
                     pointmark(pa), pointmark(pb));
              horrors++;
            }
          }
        }
      }
    }
    // Loop the six edge of this tet.
    neightet.tet = tetloop.tet;
    for (i = 0; i < 6; i++) {
      neightet.ver = edge2ver[i];
      if (edgemarked(neightet)) {
        // A possible bug. Report it.
        printf("  !! A marked edge: (%d, %d, %d, %d) -- x%lx %d.\n",
               pointmark(org(neightet)), pointmark(dest(neightet)),
               pointmark(apex(neightet)), pointmark(oppo(neightet)),
               (uintptr_t) neightet.tet, neightet.ver);
        // Check if all tets at the edge are marked.
        spintet = neightet;
        while (1) {
          fnextself(spintet);
          if (!edgemarked(spintet)) {
            printf("  !! !! An unmarked edge (%d, %d, %d, %d) -- x%lx %d.\n",
                   pointmark(org(spintet)), pointmark(dest(spintet)),
                   pointmark(apex(spintet)), pointmark(oppo(spintet)),
                   (uintptr_t) spintet.tet, spintet.ver);
            horrors++;
          }
          if (spintet.tet == neightet.tet) break;
        }
      }
    }
    tetloop.tet = tetrahedrontraverse();
  }

  if (!b->quiet) {
    printf("  Checking seg->tet connections...\n");
  }

  miscount = 0; // Count the number of unrecovered segments.
  subsegs->traversalinit();
  sseg.shver = 0;
  sseg.sh = shellfacetraverse(subsegs);
  while (sseg.sh != NULL) {
    pa = sorg(sseg);
    pb = sdest(sseg);
    spivot(sseg, neighsh);
    if (neighsh.sh != NULL) {      
      spinsh = neighsh;
      while (1) {
        // Check seg-subface bond.
        if (((sorg(spinsh) == pa) && (sdest(spinsh) == pb)) ||
	    ((sorg(spinsh) == pb) && (sdest(spinsh) == pa))) {
          // Keep the same rotate direction.
          //if (sorg(spinsh) != pa) {          
          //  sesymself(spinsh);
          //  printf("  !! Wrong ori at subface (%d, %d, %d) -- x%lx %d\n",
          //         pointmark(sorg(spinsh)), pointmark(sdest(spinsh)),
          //         pointmark(sapex(spinsh)), (uintptr_t) spinsh.sh,
          //         spinsh.shver);
          //  horrors++;
          //}
          stpivot(spinsh, spintet);
          if (spintet.tet != NULL) {
            // Check if all tets at this segment.
            while (1) {
              tsspivot1(spintet, checkseg);
              if (checkseg.sh == NULL) {
                printf("  !! !! No seg at tet (%d, %d, %d, %d) -- x%lx %d\n",
                       pointmark(org(spintet)), pointmark(dest(spintet)),
                       pointmark(apex(spintet)), pointmark(oppo(spintet)),
                       (uintptr_t) spintet.tet, spintet.ver);
                horrors++;
              }
              if (checkseg.sh != sseg.sh) {
                printf("  !! !! Wrong seg (%d, %d) at tet (%d, %d, %d, %d)\n",
                       pointmark(sorg(checkseg)), pointmark(sdest(checkseg)),
                       pointmark(org(spintet)), pointmark(dest(spintet)),
                       pointmark(apex(spintet)), pointmark(oppo(spintet)));
                horrors++;
              }
              fnextself(spintet);
              // Stop at the next subface.
              tspivot(spintet, checksh);
              if (checksh.sh != NULL) break;
            } // while (1)
          }
        } else { 
          printf("  !! Wrong seg-subface (%d, %d, %d) -- x%lx %d connect\n",
                 pointmark(sorg(spinsh)), pointmark(sdest(spinsh)),
                 pointmark(sapex(spinsh)), (uintptr_t) spinsh.sh,
                 spinsh.shver);
          horrors++;
          break;
        } // if pa, pb
        spivotself(spinsh);
        if (spinsh.sh == NULL) break; // A dangling segment.
        if (spinsh.sh == neighsh.sh) break;
      } // while (1)
    } // if (neighsh.sh != NULL)
    // Count the number of "un-recovered" segments.
    sstpivot1(sseg, neightet);
    if (neightet.tet == NULL) {
      miscount++;
    }
    sseg.sh = shellfacetraverse(subsegs);
  }

  if (!b->quiet) {
    printf("  Checking seg->seg connections...\n");
  }

  points->traversalinit();
  pa = pointtraverse();
  while (pa != NULL) {
    if (pointtype(pa) == FREESEGVERTEX) {
      // There should be two subsegments connected at 'pa'.
      // Get a subsegment containing 'pa'.
      sdecode(point2sh(pa), sseg);
      if ((sseg.sh == NULL) || sseg.sh[3] == NULL) {
        printf("  !! Dead point-to-seg pointer at point %d.\n",
               pointmark(pa));
        horrors++;
      } else {
        sseg.shver = 0;
        if (sorg(sseg) != pa) {
          if (sdest(sseg) != pa) {
            printf("  !! Wrong point-to-seg pointer at point %d.\n",
                   pointmark(pa));
            horrors++;
          } else {
            // Find the next subsegment at 'pa'.
            senext(sseg, checkseg);
            if ((checkseg.sh == NULL) || (checkseg.sh[3] == NULL)) {
              printf("  !! Dead seg-seg connection at point %d.\n",
                     pointmark(pa));
              horrors++;
            } else {
              spivotself(checkseg);
              checkseg.shver = 0;
              if (sorg(checkseg) != pa) {
                printf("  !! Wrong seg-seg connection at point %d.\n",
                     pointmark(pa));
                horrors++;
              }
            }
          }
        } else {
          // Find the previous subsegment at 'pa'.
          senext2(sseg, checkseg);
          if ((checkseg.sh == NULL) || (checkseg.sh[3] == NULL)) {
            printf("  !! Dead seg-seg connection at point %d.\n",
                   pointmark(pa));
            horrors++;
          } else {
            spivotself(checkseg);
            checkseg.shver = 0;
            if (sdest(checkseg) != pa) {
              printf("  !! Wrong seg-seg connection at point %d.\n",
                     pointmark(pa));
              horrors++;
            }
          }
        }
      }
    }
    pa = pointtraverse();
  }

  if (horrors == 0) {
    printf("  Segments are connected properly.\n");
  } else {
    printf("  !! !! !! !! Found %d missing connections.\n", horrors);
  }
  if (miscount > 0) {
    printf("  !! !! Found %d missing segments.\n", miscount);
  }

  return horrors;
}